

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::getTimingTagsKernel
          (CLIntercept *this,cl_command_queue queue,cl_kernel kernel,cl_uint workDim,size_t *gwo,
          size_t *gws,size_t *lws,string *hostTag,string *deviceTag)

{
  cl_api_clGetKernelSubGroupInfo p_Var1;
  cl_int cVar2;
  mapped_type *pmVar3;
  cl_platform_id p_Var4;
  CLdispatchX *pCVar5;
  ostream *poVar6;
  size_t sVar7;
  size_t *psVar8;
  ulong uVar9;
  bool bVar10;
  ulong uVar11;
  cl_device_id device;
  cl_uint regCount;
  uint uStack_234;
  allocator local_211;
  size_t *local_210;
  size_t *local_208;
  size_t *local_200;
  size_t maxsgs;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  cl_uint local_1d4;
  cl_command_queue local_1d0;
  size_t pwgsm;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  size_t kwgs;
  ostringstream ss;
  
  uVar11 = (ulong)workDim;
  local_210 = gwo;
  local_208 = gws;
  std::mutex::lock(&this->m_Mutex);
  device = (cl_device_id)0x0;
  local_1d0 = queue;
  (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1091,8,&device,(size_t *)0x0);
  cacheDeviceInfo(this,device);
  if (kernel == (cl_kernel)0x0) goto LAB_001679e1;
  getShortKernelNameWithHash_abi_cxx11_((string *)&ss,this,kernel);
  std::__cxx11::string::append((string *)hostTag);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::append((string *)deviceTag);
  local_200 = lws;
  if (((this->m_Config).DevicePerformanceTimeKernelInfoTracking == true) &&
     (device != (cl_device_id)0x0)) {
    pmVar3 = std::
             map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
             ::operator[](&this->m_DeviceInfoMap,&device);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    maxsgs = 0;
    pwgsm = 0;
    kwgs = 0;
    psVar8 = lws;
    local_1d4 = workDim;
    if (lws == (size_t *)0x0) {
      psVar8 = &kwgs;
      (*(this->m_Dispatch).clGetKernelWorkGroupInfo)(kernel,device,0x11b0,8,psVar8,(size_t *)0x0);
      uVar11 = 1;
      uVar9 = 1;
      if (maxsgs == 0) goto LAB_00167246;
    }
    else {
LAB_00167246:
      uVar9 = uVar11;
      if (pmVar3->Supports_cl_khr_subgroups == true) {
        p_Var4 = getPlatform(this,device);
        pCVar5 = dispatchX(this,p_Var4);
        if (pCVar5->clGetKernelSubGroupInfoKHR ==
            (_func_cl_int_cl_kernel_cl_device_id_cl_kernel_sub_group_info_size_t_void_ptr_size_t_void_ptr_size_t_ptr
             *)0x0) {
          std::__cxx11::string::string((string *)&regCount,"clGetKernelSubGroupInfoKHR",&local_211);
          getExtensionFunctionAddress(this,p_Var4,(string *)&regCount);
          std::__cxx11::string::~string((string *)&regCount);
        }
        pCVar5 = dispatchX(this,p_Var4);
        if (pCVar5->clGetKernelSubGroupInfoKHR !=
            (_func_cl_int_cl_kernel_cl_device_id_cl_kernel_sub_group_info_size_t_void_ptr_size_t_void_ptr_size_t_ptr
             *)0x0) {
          (*pCVar5->clGetKernelSubGroupInfoKHR)
                    (kernel,device,0x2033,uVar11 << 3,psVar8,8,&maxsgs,(size_t *)0x0);
        }
      }
    }
    if (((maxsgs == 0) && (0x800fff < pmVar3->NumericVersion)) &&
       (p_Var1 = (this->m_Dispatch).clGetKernelSubGroupInfo,
       p_Var1 != (cl_api_clGetKernelSubGroupInfo)0x0)) {
      (*p_Var1)(kernel,device,0x2033,uVar9 << 3,psVar8,8,&maxsgs,(size_t *)0x0);
    }
    (*(this->m_Dispatch).clGetKernelWorkGroupInfo)(kernel,device,0x11b3,8,&pwgsm,(size_t *)0x0);
    sVar7 = maxsgs;
    if (maxsgs == 0) {
      sVar7 = pwgsm;
    }
    if (pwgsm == 0) {
      pwgsm = maxsgs;
    }
    uVar11 = pwgsm;
    if (sVar7 < pwgsm) {
      uVar11 = sVar7;
    }
    maxsgs = sVar7;
    if (uVar11 != 0) {
      poVar6 = std::operator<<((ostream *)&ss," SIMD");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    }
    _regCount = (pointer)((ulong)uStack_234 << 0x20);
    (*(this->m_Dispatch).clGetKernelWorkGroupInfo)(kernel,device,0x425b,4,&regCount,(size_t *)0x0);
    if (regCount != 0) {
      poVar6 = std::operator<<((ostream *)&ss," REG");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    }
    _regCount = (pointer)0x0;
    (*(this->m_Dispatch).clGetKernelWorkGroupInfo)(kernel,device,0x11b2,8,&regCount,(size_t *)0x0);
    workDim = local_1d4;
    if (_regCount != (pointer)0x0) {
      poVar6 = std::operator<<((ostream *)&ss," SLM=");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    }
    _regCount = (pointer)0x0;
    (*(this->m_Dispatch).clGetKernelWorkGroupInfo)(kernel,device,0x11b4,8,&regCount,(size_t *)0x0);
    if (_regCount != (pointer)0x0) {
      poVar6 = std::operator<<((ostream *)&ss," TPM=");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    }
    _regCount = (pointer)0x0;
    (*(this->m_Dispatch).clGetKernelWorkGroupInfo)(kernel,device,0x4109,8,&regCount,(size_t *)0x0);
    if (_regCount != (pointer)0x0) {
      poVar6 = std::operator<<((ostream *)&ss," SPILL=");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)deviceTag);
    std::__cxx11::string::~string((string *)&regCount);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  }
  if ((this->m_Config).DevicePerformanceTimeGWOTracking == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    std::operator<<((ostream *)&ss," GWO[ ");
    if (local_210 == (size_t *)0x0) {
      std::operator<<((ostream *)&ss,"NULL");
    }
    else if (workDim != 0) {
      std::ostream::_M_insert<unsigned_long>((ulong)&ss);
      if (workDim != 1) {
        poVar6 = std::operator<<((ostream *)&ss,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        if (2 < workDim) {
          poVar6 = std::operator<<((ostream *)&ss,", ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        }
      }
    }
    std::operator<<((ostream *)&ss," ]");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)deviceTag);
    std::__cxx11::string::~string((string *)&regCount);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  }
  if ((local_208 != (size_t *)0x0) && ((this->m_Config).DevicePerformanceTimeGWSTracking != false))
  {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    std::operator<<((ostream *)&ss," GWS[ ");
    if (workDim != 0) {
      std::ostream::_M_insert<unsigned_long>((ulong)&ss);
      if (workDim != 1) {
        poVar6 = std::operator<<((ostream *)&ss," x ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        if (2 < workDim) {
          poVar6 = std::operator<<((ostream *)&ss," x ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        }
      }
    }
    std::operator<<((ostream *)&ss," ]");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)deviceTag);
    std::__cxx11::string::~string((string *)&regCount);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  }
  if ((this->m_Config).DevicePerformanceTimeLWSTracking != true) goto LAB_001679e1;
  maxsgs = 0;
  uStack_1f0 = 0;
  local_1e8 = 0;
  pwgsm = 0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  if ((workDim < 4 && lws == (size_t *)0x0) &&
     ((this->m_Config).DevicePerformanceTimeSuggestedLWSTracking == true)) {
    p_Var4 = getPlatform(this,device);
    pCVar5 = dispatchX(this,p_Var4);
    if (pCVar5->clGetKernelSuggestedLocalWorkSizeKHR ==
        (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)0x0) {
      std::__cxx11::string::string
                ((string *)&ss,"clGetKernelSuggestedLocalWorkSizeKHR",(allocator *)&regCount);
      getExtensionFunctionAddress(this,p_Var4,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
    }
    pCVar5 = dispatchX(this,p_Var4);
    if (pCVar5->clGetKernelSuggestedLocalWorkSizeKHR ==
        (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)0x0) {
LAB_0016782c:
      pCVar5 = dispatchX(this,p_Var4);
      if (pCVar5->clGetKernelSuggestedLocalWorkSizeINTEL ==
          (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)0x0) {
        std::__cxx11::string::string
                  ((string *)&ss,"clGetKernelSuggestedLocalWorkSizeINTEL",(allocator *)&regCount);
        getExtensionFunctionAddress(this,p_Var4,(string *)&ss);
        std::__cxx11::string::~string((string *)&ss);
      }
      pCVar5 = dispatchX(this,p_Var4);
      if (pCVar5->clGetKernelSuggestedLocalWorkSizeINTEL ==
          (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)0x0)
      goto LAB_001678c2;
      psVar8 = &pwgsm;
      if (local_210 != (size_t *)0x0) {
        psVar8 = local_210;
      }
      cVar2 = (*pCVar5->clGetKernelSuggestedLocalWorkSizeINTEL)
                        (local_1d0,kernel,workDim,psVar8,local_208,&maxsgs);
      bVar10 = cVar2 == 0;
    }
    else {
      cVar2 = (*pCVar5->clGetKernelSuggestedLocalWorkSizeKHR)
                        (local_1d0,kernel,workDim,local_210,local_208,&maxsgs);
      if (cVar2 != 0) goto LAB_0016782c;
      bVar10 = true;
    }
  }
  else {
LAB_001678c2:
    bVar10 = false;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  if (bVar10) {
    std::operator<<((ostream *)&ss," SLWS[ ");
    local_200 = &maxsgs;
LAB_00167914:
    if (workDim != 0) {
      std::ostream::_M_insert<unsigned_long>((ulong)&ss);
      if (workDim != 1) {
        poVar6 = std::operator<<((ostream *)&ss," x ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        if (2 < workDim) {
          poVar6 = std::operator<<((ostream *)&ss," x ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        }
      }
    }
  }
  else {
    std::operator<<((ostream *)&ss," LWS[ ");
    if (lws != (size_t *)0x0) goto LAB_00167914;
    std::operator<<((ostream *)&ss,"NULL");
  }
  std::operator<<((ostream *)&ss," ]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)deviceTag);
  std::__cxx11::string::~string((string *)&regCount);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
LAB_001679e1:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::getTimingTagsKernel(
    const cl_command_queue queue,
    const cl_kernel kernel,
    const cl_uint workDim,
    const size_t* gwo,
    const size_t* gws,
    const size_t* lws,
    std::string& hostTag,
    std::string& deviceTag )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_device_id device = NULL;
    dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_DEVICE,
        sizeof(device),
        &device,
        NULL );

    // Cache the device info if it's not cached already, since we'll print
    // the device name and other device properties as part of the report.
    cacheDeviceInfo( device );

    if( kernel )
    {
        hostTag += getShortKernelNameWithHash(kernel);

        deviceTag += hostTag;

        if( config().DevicePerformanceTimeKernelInfoTracking && device )
        {
            const SDeviceInfo& deviceInfo = m_DeviceInfoMap[device];

            std::ostringstream  ss;
            {
                size_t  maxsgs = 0;
                size_t  pwgsm = 0;
                size_t  simd = 0;

                // Use the kernel "max subgroup size" and "preferred work
                // group size multiple" to get a reasonable estimate of
                // the kernel "SIMD size".  We'll try to query both values,
                // and if both queries are successful, we'll pick the
                // smallest one.  Empirically, this is reasonably accurate.

                // First, query the "max subgroup size":

                // The query for the max subgroup size requires passing in
                // a local work size.  We'll use the local work size provided
                // by the app if there is one, otherwise we will query the
                // max local work size for this kernel and use it.
                const size_t*   queryLWS = lws;
                cl_uint queryWorkDim = workDim;

                size_t  kwgs = 0;
                if( queryLWS == NULL )
                {
                    dispatch().clGetKernelWorkGroupInfo(
                        kernel,
                        device,
                        CL_KERNEL_WORK_GROUP_SIZE,
                        sizeof(kwgs),
                        &kwgs,
                        NULL );
                    queryLWS = &kwgs;
                    queryWorkDim = 1;
                }

                if( maxsgs == 0 &&
                    deviceInfo.Supports_cl_khr_subgroups )
                {
                    cl_platform_id  platform = getPlatform(device);
                    if( dispatchX(platform).clGetKernelSubGroupInfoKHR == NULL )
                    {
                        getExtensionFunctionAddress(
                            platform,
                            "clGetKernelSubGroupInfoKHR" );
                    }

                    const auto& dispatchX = this->dispatchX(platform);
                    if( dispatchX.clGetKernelSubGroupInfoKHR )
                    {
                        dispatchX.clGetKernelSubGroupInfoKHR(
                            kernel,
                            device,
                            CL_KERNEL_MAX_SUB_GROUP_SIZE_FOR_NDRANGE_KHR,
                            queryWorkDim * sizeof(queryLWS[0]),
                            queryLWS,
                            sizeof(maxsgs),
                            &maxsgs,
                            NULL );
                    }
                }
                if( maxsgs == 0 &&
                    deviceInfo.NumericVersion >= CL_MAKE_VERSION_KHR(2, 1, 0) &&
                    dispatch().clGetKernelSubGroupInfo )
                {
                    dispatch().clGetKernelSubGroupInfo(
                        kernel,
                        device,
                        CL_KERNEL_MAX_SUB_GROUP_SIZE_FOR_NDRANGE,
                        queryWorkDim * sizeof(queryLWS[0]),
                        queryLWS,
                        sizeof(maxsgs),
                        &maxsgs,
                        NULL );
                }

                // Next, query the "preferred work group size multiple":

                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_PREFERRED_WORK_GROUP_SIZE_MULTIPLE,
                    sizeof(pwgsm),
                    &pwgsm,
                    NULL );

                // If either query is zero, use the other query.
                // Otherwise, use the smallest query.

                maxsgs = ( maxsgs == 0 ) ? pwgsm : maxsgs;
                pwgsm = ( pwgsm == 0 ) ? maxsgs : pwgsm;
                simd = ( maxsgs < pwgsm ) ? maxsgs : pwgsm;

                if( simd )
                {
                    ss << " SIMD" << simd;
                }
            }
            {
                cl_uint regCount = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_REGISTER_COUNT_INTEL,
                    sizeof(regCount),
                    &regCount,
                    NULL );
                if( regCount )
                {
                    ss << " REG" << regCount;
                }
            }
            {
                cl_ulong slm = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_LOCAL_MEM_SIZE,
                    sizeof(slm),
                    &slm,
                    NULL );
                if( slm )
                {
                    ss << " SLM=" << slm;
                }
            }
            {
                cl_ulong tpm = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_PRIVATE_MEM_SIZE,
                    sizeof(tpm),
                    &tpm,
                    NULL );
                if( tpm )
                {
                    ss << " TPM=" << tpm;
                }
            }
            {
                cl_ulong spill = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_SPILL_MEM_SIZE_INTEL,
                    sizeof(spill),
                    &spill,
                    NULL );
                if( spill )
                {
                    ss << " SPILL=" << spill;
                }
            }
            deviceTag += ss.str();
        }

        if( config().DevicePerformanceTimeGWOTracking )
        {
            std::ostringstream  ss;
            ss << " GWO[ ";
            if( gwo )
            {
                if( workDim >= 1 )
                {
                    ss << gwo[0];
                }
                if( workDim >= 2 )
                {
                    ss << ", " << gwo[1];
                }
                if( workDim >= 3 )
                {
                    ss << ", " << gwo[2];
                }
            }
            else
            {
                ss << "NULL";
            }
            ss << " ]";
            deviceTag += ss.str();
        }

        if( config().DevicePerformanceTimeGWSTracking && gws )
        {
            std::ostringstream  ss;
            ss << " GWS[ ";
            if( workDim >= 1 )
            {
                ss << gws[0];
            }
            if( workDim >= 2 )
            {
                ss << " x " << gws[1];
            }
            if( workDim >= 3 )
            {
                ss << " x " << gws[2];
            }
            ss << " ]";
            deviceTag += ss.str();
        }

        if( config().DevicePerformanceTimeLWSTracking )
        {
            bool    useSuggestedLWS = false;
            size_t  suggestedLWS[3] = { 0, 0, 0 };
            size_t  emptyGWO[3] = { 0, 0, 0 };

            if( lws == NULL &&
                workDim <= 3 &&
                config().DevicePerformanceTimeSuggestedLWSTracking )
            {
                cl_platform_id  platform = getPlatform(device);

                // Try the cl_khr_suggested_local_work_size version first.
                if( useSuggestedLWS == false )
                {
                    if( dispatchX(platform).clGetKernelSuggestedLocalWorkSizeKHR == NULL )
                    {
                        getExtensionFunctionAddress(
                            platform,
                            "clGetKernelSuggestedLocalWorkSizeKHR" );
                    }

                    const auto& dispatchX = this->dispatchX(platform);
                    if( dispatchX.clGetKernelSuggestedLocalWorkSizeKHR )
                    {
                        cl_int testErrorCode = dispatchX.clGetKernelSuggestedLocalWorkSizeKHR(
                            queue,
                            kernel,
                            workDim,
                            gwo,
                            gws,
                            suggestedLWS );
                        useSuggestedLWS = ( testErrorCode == CL_SUCCESS );
                    }
                }

                // If this fails, try the unofficial Intel version next.
                if( useSuggestedLWS == false )
                {
                    if( dispatchX(platform).clGetKernelSuggestedLocalWorkSizeINTEL == NULL )
                    {
                        getExtensionFunctionAddress(
                            platform,
                            "clGetKernelSuggestedLocalWorkSizeINTEL" );
                    }

                    const auto& dispatchX = this->dispatchX(platform);
                    if( dispatchX.clGetKernelSuggestedLocalWorkSizeINTEL )
                    {
                        cl_int testErrorCode = dispatchX.clGetKernelSuggestedLocalWorkSizeINTEL(
                            queue,
                            kernel,
                            workDim,
                            gwo == NULL ? emptyGWO : gwo,
                            gws,
                            suggestedLWS );
                        useSuggestedLWS = ( testErrorCode == CL_SUCCESS );
                    }
                }
            }

            std::ostringstream  ss;
            if( useSuggestedLWS )
            {
                ss << " SLWS[ ";
                lws = suggestedLWS;
            }
            else
            {
                ss << " LWS[ ";
            }

            if( lws )
            {
                if( workDim >= 1 )
                {
                    ss << lws[0];
                }
                if( workDim >= 2 )
                {
                    ss << " x " << lws[1];
                }
                if( workDim >= 3 )
                {
                    ss << " x " << lws[2];
                }
            }
            else
            {
                ss << "NULL";
            }

            ss << " ]";
            deviceTag += ss.str();
        }
    }
}